

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCall_callWithTwoIntegerParameter_TestShell::createTest
          (TEST_MockExpectedCall_callWithTwoIntegerParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithTwoIntegerParameter_Test *this_00;
  TEST_MockExpectedCall_callWithTwoIntegerParameter_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCall_callWithTwoIntegerParameter_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x1af);
  TEST_MockExpectedCall_callWithTwoIntegerParameter_Test::
  TEST_MockExpectedCall_callWithTwoIntegerParameter_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callWithTwoIntegerParameter)
{
    int expected_value = 1;
    int another_expected_value = -1;

    call->withParameter("integer1", expected_value);
    call->withParameter("integer2", another_expected_value);
    STRCMP_EQUAL("int", call->getInputParameterType("integer1").asCharString());
    STRCMP_EQUAL("int", call->getInputParameterType("integer2").asCharString());
    LONGS_EQUAL(expected_value, call->getInputParameter("integer1").getIntValue());
    LONGS_EQUAL(another_expected_value, call->getInputParameter("integer2").getIntValue());
}